

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZContBufferedStream.cpp
# Opt level: O0

TPZContBufferedStream * __thiscall
TPZContBufferedStream::operator=(TPZContBufferedStream *this,TPZContBufferedStream *other)

{
  char *pcVar1;
  long in_RSI;
  TPZContBufferedStream *in_RDI;
  
  in_RDI->fNAllocatedBytes = *(size_t *)(in_RSI + 0x20);
  if ((in_RDI->fBuffer != (char *)0x0) && (in_RDI->fBuffer != (char *)0x0)) {
    operator_delete__(in_RDI->fBuffer);
  }
  pcVar1 = (char *)operator_new__(in_RDI->fNAllocatedBytes);
  in_RDI->fBuffer = pcVar1;
  memcpy(in_RDI->fBuffer,*(void **)(in_RSI + 8),*(size_t *)(in_RSI + 0x28));
  in_RDI->fSize = *(size_t *)(in_RSI + 0x28);
  in_RDI->fFirst = in_RDI->fBuffer + (*(long *)(in_RSI + 0x10) - *(long *)(in_RSI + 8));
  in_RDI->fLast = in_RDI->fFirst + (in_RDI->fSize - 1);
  return in_RDI;
}

Assistant:

TPZContBufferedStream &TPZContBufferedStream::
        operator=(const TPZContBufferedStream &other) {
    fNAllocatedBytes = other.fNAllocatedBytes;
    if (fBuffer)
        delete[] fBuffer;
    fBuffer = new char[fNAllocatedBytes];
    memcpy(fBuffer, other.fBuffer, other.fSize);
    fSize = other.fSize;
    fFirst = fBuffer + (other.fFirst-other.fBuffer);
    fLast = fFirst - 1 + fSize;
    return *this;
}